

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_ini_writer::
w_sections<std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>,ini_write_object>
          (xr_ini_writer *this,
          vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
          *container,undefined8 param_3)

{
  bool bVar1;
  reference object;
  allocator<char> local_61;
  string local_60;
  int local_3c;
  const_iterator cStack_38;
  uint32_t id;
  const_iterator end;
  const_iterator it;
  char *prefix_local;
  vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *container_local
  ;
  xr_ini_writer *this_local;
  
  end = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
        begin(container);
  cStack_38 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ::end(container);
  local_3c = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"%s_%d",&local_61);
    local_3c = local_3c + 1;
    open_section(this,&local_60,param_3);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    object = __gnu_cxx::
             __normal_iterator<xray_re::xr_custom_object_*const_*,_std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>_>
             ::operator*(&end);
    ini_write_object::operator()((ini_write_object *)((long)&this_local + 7),object,this);
    close_section(this);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_custom_object_*const_*,_std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_sections(const T& container, F write, const char* prefix)
{
	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
		open_section("%s_%d", prefix, id++);
		write(*it, this);
		close_section();
	}
}